

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_2::ValidateAccessChain(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  ushort uVar2;
  uint32_t id;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int32_t iVar7;
  char *pcVar8;
  long *plVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  DiagnosticStream *pDVar12;
  long *plVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  size_t index;
  long lVar17;
  spv_result_t unaff_R13D;
  bool bVar18;
  string instr_name;
  int64_t cur_index;
  Instruction *local_278;
  long *local_270;
  long local_260;
  long lStack_258;
  char *local_250;
  string local_248;
  Instruction *local_228;
  long local_220;
  long local_218;
  ulong local_210;
  undefined1 *local_208 [2];
  long local_1f8 [56];
  spv_result_t local_38;
  
  pcVar8 = spvOpcodeString((uint)(inst->inst_).opcode);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,pcVar8,(allocator<char> *)&local_248);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0x262e8f);
  local_270 = &local_260;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_260 = *plVar13;
    lStack_258 = plVar9[3];
  }
  else {
    local_260 = *plVar13;
    local_270 = (long *)*plVar9;
  }
  lVar14 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_208[0] != &((DiagnosticStream *)local_208)->field_0x10) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  bVar4 = spvOpcodeGeneratesUntypedPointer((uint)(inst->inst_).opcode);
  pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
  if (bVar4) {
    if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x1141)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_270,lVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(inst->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
      pcVar8 = " must be OpTypeUntypedPointerKHR. Found Op";
      lVar14 = 0x2a;
      goto LAB_001fe098;
    }
LAB_001fdf76:
    index = 2;
    if (bVar4) {
      uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar11 = ValidationState_t::FindDef(_,uVar6);
      if ((((pIVar11 == (Instruction *)0x0) ||
           (iVar7 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar7 == 0)) ||
          (uVar1 = (pIVar11->inst_).opcode, uVar1 == 0x1141)) || (uVar1 == 0x20)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Base type must be a non-pointer type",0x24);
        unaff_R13D = local_38;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar18 = false;
      }
      else {
        bVar18 = true;
      }
      index = 3;
      if (!bVar18) goto LAB_001fe0ff;
    }
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,index);
    pIVar11 = ValidationState_t::FindDef(_,uVar6);
    pIVar11 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
    if ((pIVar11 == (Instruction *)0x0) ||
       (uVar1 = (pIVar11->inst_).opcode, (uVar1 != 0x1141 || !bVar4) && uVar1 != 0x20)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"The Base <id> ",0xe);
      ValidationState_t::getIdName_abi_cxx11_(&local_248,_,uVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," in ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_270,lVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," instruction must be a pointer.",0x1f);
      unaff_R13D = local_38;
      goto LAB_001fe0d8;
    }
    puVar3 = (pIVar11->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[2] == puVar3[2]) {
      if (bVar4) {
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      }
      else {
        uVar6 = puVar3[3];
      }
      local_278 = ValidationState_t::FindDef(_,uVar6);
      uVar1 = (inst->inst_).opcode;
      if ((((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) -
          (ulong)((uVar1 == 0x46 || uVar1 == 0x43) || (ushort)(uVar1 + 0xeeb9) < 2)) - 4 <=
          (ulong)(_->options_->universal_limits_).max_access_chain_indexes) {
        uVar15 = (ulong)bVar4 +
                 (ulong)((uVar1 == 0x46 || uVar1 == 0x43) || (ushort)(uVar1 + 0xeeb9) < 2) + 4;
        while( true ) {
          puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          bVar18 = (ulong)((long)(inst->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <=
                   uVar15;
          if (bVar18) break;
          id = puVar3[uVar15];
          local_210 = uVar15;
          local_228 = ValidationState_t::FindDef(_,id);
          pIVar11 = ValidationState_t::FindDef(_,(local_228->inst_).type_id);
          if ((pIVar11 == (Instruction *)0x0) || ((pIVar11->inst_).opcode != 0x15)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Indexes passed to ",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_270,lVar14);
            lVar16 = 0x19;
            pcVar8 = " must be of type integer.";
LAB_001fe497:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar8,lVar16);
            unaff_R13D = local_38;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar5 = false;
          }
          else {
            uVar2 = (local_278->inst_).opcode;
            if (uVar2 < 0x1f) {
              if ((0x31800000U >> (uVar2 & 0x1f) & 1) == 0) {
                if (uVar2 != 0x1e) goto LAB_001fe527;
                bVar5 = ValidationState_t::EvalConstantValInt64(_,id,(int64_t *)&local_250);
                if (!bVar5) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,local_228);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"The <id> passed to ",0x13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,(char *)local_270,lVar14);
                  lVar16 = 0x31;
                  pcVar8 = " to index into a structure must be an OpConstant.";
                  goto LAB_001fe497;
                }
                puVar3 = (local_278->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar17 = (long)(local_278->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
                lVar16 = lVar17 + -2;
                bVar5 = -1 < (long)local_250 && (long)local_250 < lVar16;
                if (-1 < (long)local_250 && (long)local_250 < lVar16) {
                  local_278 = ValidationState_t::FindDef(_,puVar3[(long)(local_250 + 2)]);
                }
                else {
                  local_220 = lVar16;
                  local_218 = lVar17;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,local_228);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,"Index is out of bounds: ",0x18);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,(char *)local_270,lVar14);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," cannot find index ",0x13);
                  std::ostream::_M_insert<long>((long)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," into the structure <id> ",0x19);
                  ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(local_278->inst_).result_id)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_248._M_dataplus._M_p,
                             local_248._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,". This structure has ",0x15);
                  std::ostream::_M_insert<long>((long)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208," members. Largest valid index is ",0x21);
                  std::ostream::_M_insert<long>((long)local_208);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
                  unaff_R13D = local_38;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
                }
                goto LAB_001fe4af;
              }
            }
            else {
LAB_001fe527:
              if ((uVar2 != 0x14ee) && (uVar2 != 0x1168)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,(char *)local_270,lVar14);
                lVar16 = 0x47;
                pcVar8 = " reached non-composite type while indexes still remain to be traversed.";
                goto LAB_001fe497;
              }
            }
            local_278 = ValidationState_t::FindDef
                                  (_,(local_278->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2]);
            bVar5 = true;
          }
LAB_001fe4af:
          if (!bVar5) break;
          uVar15 = local_210 + 1;
        }
        if (bVar18) {
          if ((bVar4) ||
             (pIVar10 = ValidationState_t::FindDef
                                  (_,(pIVar10->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3]),
             (local_278->inst_).result_id == (pIVar10->inst_).result_id)) {
            unaff_R13D = SPV_SUCCESS;
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_270,lVar14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," result type (Op",0x10);
            local_248._M_dataplus._M_p = spvOpcodeString((uint)(pIVar10->inst_).opcode);
            pDVar12 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_208,(char **)&local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar12,
                       ") does not match the type that results from indexing into the base <id> (Op"
                       ,0x4b);
            local_250 = spvOpcodeString((uint)(local_278->inst_).opcode);
            pDVar12 = DiagnosticStream::operator<<(pDVar12,&local_250);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar12,").",2);
            unaff_R13D = pDVar12->error_;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          }
        }
        goto LAB_001fe0ff;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"The number of indexes in ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_270,lVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," may not exceed ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,". Found ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      pcVar8 = " indexes.";
      lVar14 = 9;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 "The result pointer storage class and base pointer storage class in ",0x43);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_270,lVar14);
      pcVar8 = " do not match.";
      lVar14 = 0xe;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar8,lVar14);
    unaff_R13D = local_38;
  }
  else {
    if ((pIVar10 != (Instruction *)0x0) && ((pIVar10->inst_).opcode == 0x20)) goto LAB_001fdf76;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"The Result Type of ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_270,lVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," <id> ",6);
    ValidationState_t::getIdName_abi_cxx11_(&local_248,_,(inst->inst_).result_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
    pcVar8 = " must be OpTypePointer. Found Op";
    lVar14 = 0x20;
LAB_001fe098:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar8,lVar14);
    local_250 = spvOpcodeString((uint)(pIVar10->inst_).opcode);
    pDVar12 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_250);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar12,".",1);
    unaff_R13D = pDVar12->error_;
LAB_001fe0d8:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_001fe0ff:
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  return unaff_R13D;
}

Assistant:

spv_result_t ValidateAccessChain(ValidationState_t& _,
                                 const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  const bool untyped_pointer = spvOpcodeGeneratesUntypedPointer(inst->opcode());

  // The result type must be OpTypePointer for regular access chains and an
  // OpTypeUntypedPointerKHR for untyped access chains.
  auto result_type = _.FindDef(inst->type_id());
  if (untyped_pointer) {
    if (!result_type ||
        spv::Op::OpTypeUntypedPointerKHR != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id())
             << " must be OpTypeUntypedPointerKHR. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  } else {
    if (!result_type || spv::Op::OpTypePointer != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id()) << " must be OpTypePointer. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  }

  if (untyped_pointer) {
    // Base type must be a non-pointer type.
    const auto base_type = _.FindDef(inst->GetOperandAs<uint32_t>(2));
    if (!base_type || !spvOpcodeGeneratesType(base_type->opcode()) ||
        base_type->opcode() == spv::Op::OpTypePointer ||
        base_type->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Base type must be a non-pointer type";
    }
  }

  // Base must be a pointer, pointing to the base of a composite object.
  const auto base_index = untyped_pointer ? 3 : 2;
  const auto base_id = inst->GetOperandAs<uint32_t>(base_index);
  const auto base = _.FindDef(base_id);
  const auto base_type = _.FindDef(base->type_id());
  if (!base_type || !(spv::Op::OpTypePointer == base_type->opcode() ||
                      (untyped_pointer && spv::Op::OpTypeUntypedPointerKHR ==
                                              base_type->opcode()))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Base <id> " << _.getIdName(base_id) << " in " << instr_name
           << " instruction must be a pointer.";
  }

  // The result pointer storage class and base pointer storage class must match.
  // Word 2 of OpTypePointer is the Storage Class.
  auto result_type_storage_class = result_type->word(2);
  auto base_type_storage_class = base_type->word(2);
  if (result_type_storage_class != base_type_storage_class) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The result pointer storage class and base "
              "pointer storage class in "
           << instr_name << " do not match.";
  }

  // The type pointed to by OpTypePointer (word 3) must be a composite type.
  auto type_pointee = untyped_pointer
                          ? _.FindDef(inst->GetOperandAs<uint32_t>(2))
                          : _.FindDef(base_type->word(3));

  // Check Universal Limit (SPIR-V Spec. Section 2.17).
  // The number of indexes passed to OpAccessChain may not exceed 255
  // The instruction includes 4 words + N words (for N indexes)
  size_t num_indexes = inst->words().size() - 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    // In pointer access chains, the element operand is required, but not
    // counted as an index.
    --num_indexes;
  }
  const size_t num_indexes_limit =
      _.options()->universal_limits_.max_access_chain_indexes;
  if (num_indexes > num_indexes_limit) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The number of indexes in " << instr_name << " may not exceed "
           << num_indexes_limit << ". Found " << num_indexes << " indexes.";
  }
  // Indexes walk the type hierarchy to the desired depth, potentially down to
  // scalar granularity. The first index in Indexes will select the top-level
  // member/element/component/element of the base composite. All composite
  // constituents use zero-based numbering, as described by their OpType...
  // instruction. The second index will apply similarly to that result, and so
  // on. Once any non-composite type is reached, there must be no remaining
  // (unused) indexes.
  auto starting_index = untyped_pointer ? 5 : 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    ++starting_index;
  }
  for (size_t i = starting_index; i < inst->words().size(); ++i) {
    const uint32_t cur_word = inst->words()[i];
    // Earlier ID checks ensure that cur_word definition exists.
    auto cur_word_instr = _.FindDef(cur_word);
    // The index must be a scalar integer type (See OpAccessChain in the Spec.)
    auto index_type = _.FindDef(cur_word_instr->type_id());
    if (!index_type || spv::Op::OpTypeInt != index_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Indexes passed to " << instr_name
             << " must be of type integer.";
    }
    switch (type_pointee->opcode()) {
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray: {
        // In OpTypeMatrix, OpTypeVector, spv::Op::OpTypeCooperativeMatrixNV,
        // OpTypeArray, and OpTypeRuntimeArray, word 2 is the Element Type.
        type_pointee = _.FindDef(type_pointee->word(2));
        break;
      }
      case spv::Op::OpTypeStruct: {
        // In case of structures, there is an additional constraint on the
        // index: the index must be an OpConstant.
        int64_t cur_index;
        if (!_.EvalConstantValInt64(cur_word, &cur_index)) {
          return _.diag(SPV_ERROR_INVALID_ID, cur_word_instr)
                 << "The <id> passed to " << instr_name
                 << " to index into a "
                    "structure must be an OpConstant.";
        }

        // The index points to the struct member we want, therefore, the index
        // should be less than the number of struct members.
        const int64_t num_struct_members =
            static_cast<int64_t>(type_pointee->words().size() - 2);
        if (cur_index >= num_struct_members || cur_index < 0) {
          return _.diag(SPV_ERROR_INVALID_ID, cur_word_instr)
                 << "Index is out of bounds: " << instr_name
                 << " cannot find index " << cur_index
                 << " into the structure <id> "
                 << _.getIdName(type_pointee->id()) << ". This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        // Struct members IDs start at word 2 of OpTypeStruct.
        const size_t word_index = static_cast<size_t>(cur_index) + 2;
        auto structMemberId = type_pointee->word(word_index);
        type_pointee = _.FindDef(structMemberId);
        break;
      }
      default: {
        // Give an error. reached non-composite type while indexes still remain.
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << instr_name
               << " reached non-composite type while indexes "
                  "still remain to be traversed.";
      }
    }
  }

  if (!untyped_pointer) {
    // Result type is a pointer. Find out what it's pointing to.
    // This will be used to make sure the indexing results in the same type.
    // OpTypePointer word 3 is the type being pointed to.
    const auto result_type_pointee = _.FindDef(result_type->word(3));
    // At this point, we have fully walked down from the base using the indeces.
    // The type being pointed to should be the same as the result type.
    if (type_pointee->id() != result_type_pointee->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << instr_name << " result type (Op"
             << spvOpcodeString(
                    static_cast<spv::Op>(result_type_pointee->opcode()))
             << ") does not match the type that results from indexing into the "
                "base "
                "<id> (Op"
             << spvOpcodeString(static_cast<spv::Op>(type_pointee->opcode()))
             << ").";
    }
  }

  return SPV_SUCCESS;
}